

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  size_t __n;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte bVar20;
  void *__s2;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  byte *pbVar24;
  bool bVar25;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar4 = pZip->m_pState;
  if (pName != (char *)0x0 && pmVar4 != (mz_zip_internal_state *)0x0) {
    if ((((pmVar4->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
       (pComment == (char *)0x0 && (flags & 0x300) == 0)) {
      if ((pmVar4->m_sorted_central_dir_offsets).m_size != 0) {
        pvVar5 = (pmVar4->m_sorted_central_dir_offsets).m_p;
        uVar3 = pZip->m_total_files;
        sVar10 = strlen(pName);
        if (pIndex != (mz_uint32 *)0x0) {
          *pIndex = 0;
        }
        if ((ulong)uVar3 != 0) {
          lVar21 = (ulong)uVar3 - 1;
          pvVar6 = (pmVar4->m_central_dir).m_p;
          lVar16 = 0;
          do {
            uVar22 = (lVar21 - lVar16 >> 1) + lVar16;
            uVar3 = *(uint *)((long)pvVar5 + (uVar22 & 0xffffffff) * 4);
            uVar11 = (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + (ulong)uVar3 * 4);
            pbVar18 = (byte *)((long)pvVar6 + uVar11 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar6 + uVar11 + 0x1c);
            uVar23 = (ulong)uVar2;
            if ((uint)sVar10 <= (uint)uVar2) {
              uVar23 = sVar10 & 0xffffffff;
            }
            pbVar19 = (byte *)((long)pvVar6 + uVar23 + uVar11 + 0x2e);
            pbVar24 = (byte *)pName;
            if ((int)uVar23 == 0) {
              iVar9 = 0;
            }
            else {
              do {
                bVar1 = *pbVar18;
                bVar14 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar14 = bVar1;
                }
                bVar1 = *pbVar24;
                bVar20 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar20 = bVar1;
                }
                if (bVar14 != bVar20) break;
                pbVar18 = pbVar18 + 1;
                pbVar24 = pbVar24 + 1;
                bVar20 = bVar14;
              } while (pbVar18 < pbVar19);
              iVar9 = (uint)bVar14 - (uint)bVar20;
            }
            if (pbVar18 == pbVar19) {
              iVar9 = (uint)uVar2 - (uint)sVar10;
            }
            if (iVar9 == 0) {
              if (pIndex != (mz_uint32 *)0x0) {
                *pIndex = uVar3;
                return 1;
              }
              return 1;
            }
            lVar8 = uVar22 - 1;
            if (iVar9 < 0) {
              lVar16 = uVar22 + 1;
              lVar8 = lVar21;
            }
            lVar21 = lVar8;
          } while (lVar16 <= lVar21);
        }
        pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
        return 0;
      }
      sVar10 = strlen(pName);
      if (0xffff < sVar10) goto LAB_00108bfc;
      __n = 0;
    }
    else {
      sVar10 = strlen(pName);
      if (0xffff < sVar10) goto LAB_00108bfc;
      if (pComment == (char *)0x0) {
        __n = 0;
      }
      else {
        __n = strlen(pComment);
        if (0xffff < __n) {
          pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
          return 0;
        }
      }
    }
    uVar3 = pZip->m_total_files;
    if ((ulong)uVar3 != 0) {
      pvVar5 = (pmVar4->m_central_dir).m_p;
      pvVar6 = (pmVar4->m_central_dir_offsets).m_p;
      uVar22 = 0;
      do {
        uVar23 = (ulong)*(uint *)((long)pvVar6 + uVar22 * 4);
        uVar2 = *(ushort *)((long)pvVar5 + uVar23 + 0x1c);
        uVar11 = (ulong)uVar2;
        if (sVar10 <= uVar11) {
          __s2 = (void *)((long)pvVar5 + uVar23 + 0x2e);
          if (__n == 0) goto LAB_00108d68;
          if (__n != *(ushort *)((long)pvVar5 + uVar23 + 0x20)) goto LAB_00108e51;
          uVar15 = (ulong)*(ushort *)((long)pvVar5 + uVar23 + 0x1e);
          if ((flags >> 8 & 1) == 0) {
            sVar12 = 0;
            do {
              bVar1 = pComment[sVar12];
              iVar9 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                iVar9 = (int)(char)bVar1;
              }
              bVar1 = *(byte *)((long)pvVar5 + sVar12 + uVar23 + uVar15 + uVar11 + 0x2e);
              iVar17 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                iVar17 = (int)(char)bVar1;
              }
              if (iVar9 != iVar17) goto LAB_00108e51;
              sVar12 = sVar12 + 1;
            } while (__n != sVar12);
LAB_00108d68:
            if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
              do {
                uVar13 = *(byte *)((long)__s2 + (uVar11 - 1 & 0xffffffff)) - 0x2f;
                if ((uVar13 < 0x2e) && ((0x200000000801U >> ((ulong)uVar13 & 0x3f) & 1) != 0))
                goto LAB_00108da9;
                bVar7 = 1 < (long)uVar11;
                uVar11 = uVar11 - 1;
              } while (bVar7);
              uVar11 = 0;
LAB_00108da9:
              __s2 = (void *)((long)__s2 + (uVar11 & 0xffffffff));
              uVar11 = (ulong)((uint)uVar2 - (int)uVar11);
            }
            if (sVar10 != uVar11) goto LAB_00108e51;
            if ((flags >> 8 & 1) == 0) {
              if ((int)uVar11 != 0) {
                sVar12 = 0;
                do {
                  bVar1 = pName[sVar12];
                  iVar9 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar9 = (int)(char)bVar1;
                  }
                  bVar1 = *(byte *)((long)__s2 + sVar12);
                  iVar17 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar17 = (int)(char)bVar1;
                  }
                  if (iVar9 != iVar17) goto LAB_00108e51;
                  sVar12 = sVar12 + 1;
                } while (sVar10 != sVar12);
              }
              bVar25 = false;
            }
            else {
              iVar9 = bcmp(pName,__s2,sVar10);
              bVar25 = iVar9 != 0;
            }
            bVar7 = (bool)(bVar25 ^ 1);
            if ((pIndex != (mz_uint32 *)0x0) && (!bVar25)) {
              *pIndex = (mz_uint32)uVar22;
              return 1;
            }
          }
          else {
            iVar9 = bcmp(pComment,(void *)((long)__s2 + uVar11 + uVar15),__n);
            bVar7 = false;
            if (iVar9 == 0) goto LAB_00108d68;
          }
          if (bVar7) {
            return 1;
          }
        }
LAB_00108e51:
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar3);
    }
    pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
    return 0;
  }
LAB_00108bfc:
  pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  return 0;
}

Assistant:

mz_bool mz_zip_reader_locate_file_v2(mz_zip_archive *pZip, const char *pName,
                                     const char *pComment, mz_uint flags,
                                     mz_uint32 *pIndex) {
  mz_uint file_index;
  size_t name_len, comment_len;

  if (pIndex)
    *pIndex = 0;

  if ((!pZip) || (!pZip->m_pState) || (!pName))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  /* See if we can use a binary search */
  if (((pZip->m_pState->m_init_flags &
        MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0) &&
      (pZip->m_zip_mode == MZ_ZIP_MODE_READING) &&
      ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) &&
      (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size)) {
    return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
  }

  /* Locate the entry by scanning the entire central directory */
  name_len = strlen(pName);
  if (name_len > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(
        &pZip->m_pState->m_central_dir, mz_uint8,
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                             file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename =
        (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS),
              file_comment_len =
                  MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) ||
          (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len,
                                flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') ||
            (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) &&
        (mz_zip_string_equal(pName, pFilename, filename_len, flags))) {
      if (pIndex)
        *pIndex = file_index;
      return MZ_TRUE;
    }
  }

  return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}